

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::parse_multipart_formdata(string *boundary,string *body,MultipartFiles *files)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  pointer psVar5;
  ulong uVar6;
  string *this;
  bool bVar7;
  smatch m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  string name;
  MultipartFile file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dash_boundary;
  undefined1 local_128 [32];
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  long local_e0;
  long local_d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,httplib::MultipartFile>,std::_Select1st<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
  *local_a8;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ulong local_60;
  size_t sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,httplib::MultipartFile>,std::_Select1st<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
              *)files;
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::dash_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::dash_abi_cxx11_), iVar2 != 0)) {
    parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
    ::dash_abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                   ::dash_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::dash_abi_cxx11_,"--","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::dash_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::crlf_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::crlf_abi_cxx11_), iVar2 != 0)) {
    parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
    ::crlf_abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                   ::crlf_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::crlf_abi_cxx11_,"\r\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::crlf_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::crlf_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_type_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_type_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_type_abi_cxx11_,"Content-Type: (.*?)",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_type_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_type_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_disposition_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_disposition_abi_cxx11_,
               "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_disposition_abi_cxx11_);
  }
  std::operator+(&local_50,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,boundary);
  bVar7 = false;
  lVar3 = std::__cxx11::string::find((char *)body,(ulong)local_50._M_dataplus._M_p,0);
  if (lVar3 == 0) {
    lVar3 = std::__cxx11::string::find
                      ((char *)body,
                       (ulong)parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                              ::crlf_abi_cxx11_._M_dataplus._M_p,local_50._M_string_length);
    if (lVar3 == -1) {
LAB_001467a3:
      bVar7 = false;
    }
    else {
      uVar6 = lVar3 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                      ::crlf_abi_cxx11_._M_string_length;
      do {
        bVar7 = body->_M_string_length <= uVar6;
        if (bVar7) {
          bVar7 = true;
          break;
        }
        uVar4 = std::__cxx11::string::find
                          ((char *)body,
                           (ulong)parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                  ::crlf_abi_cxx11_._M_dataplus._M_p,uVar6);
        if (uVar4 == 0xffffffffffffffff) goto LAB_001467a3;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_a0._0_8_ = local_a0 + 0x10;
        local_a0._8_8_ = 0;
        local_a0[0x10] = '\0';
        local_80._M_p = (pointer)&local_70;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_60 = 0;
        sStack_58 = 0;
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)body);
        while (uVar4 != uVar6) {
          local_128._16_8_ = (pointer)0x0;
          local_128._24_8_ = (char *)0x0;
          local_128._0_8_ = (pointer)0x0;
          local_128._8_8_ = (pointer)0x0;
          bVar1 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_e8._M_current + local_e0),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_128,
                             &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                              ::re_content_type_abi_cxx11_,0);
          if (bVar1) {
            lVar3 = local_128._8_8_ - local_128._0_8_;
            if ((lVar3 == 0) || (0xfffffffffffffffd < (lVar3 >> 3) * -0x5555555555555555 - 5U)) {
              psVar5 = (pointer)(local_128._0_8_ + lVar3 + -0x48);
            }
            else {
              psVar5 = (pointer)(local_128._0_8_ + 0x18);
            }
            if (psVar5->matched == true) {
              local_108 = &local_f8;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_108,
                         (psVar5->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current,
                         (psVar5->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current);
            }
            else {
              local_100 = 0;
              local_f8 = 0;
              local_108 = &local_f8;
            }
            this = (string *)&local_80;
LAB_0014658f:
            std::__cxx11::string::operator=(this,(string *)&local_108);
            if (local_108 != &local_f8) {
              operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
            }
          }
          else {
            bVar1 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_e8._M_current + local_e0),
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_128,
                               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                ::re_content_disposition_abi_cxx11_,0);
            if (bVar1) {
              lVar3 = local_128._8_8_ - local_128._0_8_;
              if ((lVar3 == 0) || (0xfffffffffffffffd < (lVar3 >> 3) * -0x5555555555555555 - 5U)) {
                psVar5 = (pointer)(local_128._0_8_ + lVar3 + -0x48);
              }
              else {
                psVar5 = (pointer)(local_128._0_8_ + 0x18);
              }
              if (psVar5->matched == true) {
                local_108 = &local_f8;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)&local_108,
                           (psVar5->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).first._M_current,
                           (psVar5->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).second._M_current);
              }
              else {
                local_100 = 0;
                local_f8 = 0;
                local_108 = &local_f8;
              }
              std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_108);
              if (local_108 != &local_f8) {
                operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
              }
              lVar3 = local_128._8_8_ - local_128._0_8_;
              if ((lVar3 == 0) || (0xfffffffffffffffc < (lVar3 >> 3) * -0x5555555555555555 - 6U)) {
                psVar5 = (pointer)(local_128._0_8_ + lVar3 + -0x48);
              }
              else {
                psVar5 = (pointer)(local_128._0_8_ + 0x30);
              }
              if (psVar5->matched == true) {
                local_108 = &local_f8;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)&local_108,
                           (psVar5->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).first._M_current,
                           (psVar5->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).second._M_current);
              }
              else {
                local_100 = 0;
                local_f8 = 0;
                local_108 = &local_f8;
              }
              this = (string *)local_a0;
              goto LAB_0014658f;
            }
          }
          uVar6 = uVar4 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                          ::crlf_abi_cxx11_._M_string_length;
          uVar4 = std::__cxx11::string::find
                            ((char *)body,
                             (ulong)parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                    ::crlf_abi_cxx11_._M_dataplus._M_p,uVar6);
          if (uVar4 == 0xffffffffffffffff) {
            if ((pointer)local_128._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
            goto LAB_00146703;
          }
          std::__cxx11::string::substr((ulong)&local_108,(ulong)body);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
          if (local_108 != &local_f8) {
            operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
          }
          if ((pointer)local_128._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
          }
        }
        uVar4 = uVar6 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                        ::crlf_abi_cxx11_._M_string_length;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,
                       &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                        ::crlf_abi_cxx11_,&local_50);
        lVar3 = std::__cxx11::string::find((char *)body,local_128._0_8_,uVar4);
        if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
        uVar6 = uVar4;
        if (lVar3 == -1) {
LAB_00146703:
          bVar1 = false;
        }
        else {
          sStack_58 = lVar3 - uVar4;
          uVar6 = lVar3 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                          ::crlf_abi_cxx11_._M_string_length + local_50._M_string_length;
          local_60 = uVar4;
          lVar3 = std::__cxx11::string::find
                            ((char *)body,
                             (ulong)parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                    ::crlf_abi_cxx11_._M_dataplus._M_p,uVar6);
          if (lVar3 == -1) goto LAB_00146703;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,httplib::MultipartFile>,std::_Select1st<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
          ::_M_emplace_equal<std::__cxx11::string&,httplib::MultipartFile&>
                    (local_a8,&local_c8,(MultipartFile *)local_a0);
          uVar6 = lVar3 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                          ::crlf_abi_cxx11_._M_string_length;
          bVar1 = true;
        }
        if ((long *)local_e8._M_current != local_d8) {
          operator_delete(local_e8._M_current,local_d8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,
                          CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      } while (bVar1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

inline bool parse_multipart_formdata(
    const std::string& boundary, const std::string& body, MultipartFiles& files)
{
    static std::string dash = "--";
    static std::string crlf = "\r\n";

    static std::regex re_content_type(
        "Content-Type: (.*?)", std::regex_constants::icase);

    static std::regex re_content_disposition(
        "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",
        std::regex_constants::icase);

    auto dash_boundary = dash + boundary;

    auto pos = body.find(dash_boundary);
    if (pos != 0) {
        return false;
    }

    pos += dash_boundary.size();

    auto next_pos = body.find(crlf, pos);
    if (next_pos == std::string::npos) {
        return false;
    }

    pos = next_pos + crlf.size();

    while (pos < body.size()) {
        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        std::string name;
        MultipartFile file;

        auto header = body.substr(pos, (next_pos - pos));

        while (pos != next_pos) {
            std::smatch m;
            if (std::regex_match(header, m, re_content_type)) {
                file.content_type = m[1];
            } else if (std::regex_match(header, m, re_content_disposition)) {
                name = m[1];
                file.filename = m[2];
            }

            pos = next_pos + crlf.size();

            next_pos = body.find(crlf, pos);
            if (next_pos == std::string::npos) {
                return false;
            }

            header = body.substr(pos, (next_pos - pos));
        }

        pos = next_pos + crlf.size();

        next_pos = body.find(crlf + dash_boundary, pos);

        if (next_pos == std::string::npos) {
            return false;
        }

        file.offset = pos;
        file.length = next_pos - pos;

        pos = next_pos + crlf.size() + dash_boundary.size();

        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        files.emplace(name, file);

        pos = next_pos + crlf.size();
    }

    return true;
}